

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void ClipperLib::Minkowski(Path *poly,Path *path,Paths *solution,bool isSum,bool isClosed)

{
  pointer pIVar1;
  double dVar2;
  cInt cVar3;
  Paths *this;
  pointer pIVar4;
  IntPoint *pIVar5;
  undefined7 in_register_00000009;
  IntPoint *pIVar6;
  ulong uVar7;
  ulong uVar8;
  IntPoint *pIVar9;
  ulong uVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  undefined3 in_register_00000081;
  uint uVar13;
  long lVar14;
  Path p;
  Paths pp;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_b8;
  ulong local_98;
  ulong local_90;
  size_type local_88;
  size_type local_80;
  IntPoint local_78;
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  local_68;
  pointer local_50;
  pointer local_48;
  Paths *local_40;
  ulong local_38;
  
  uVar13 = CONCAT31(in_register_00000081,isClosed);
  local_98 = CONCAT44(local_98._4_4_,(int)CONCAT71(in_register_00000009,isSum));
  local_48 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
             ._M_impl.super__Vector_impl_data._M_start;
  local_50 = (poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  pIVar4 = (path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)pIVar1 - (long)pIVar4 >> 4;
  local_68.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = solution;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(&local_68,__n);
  local_90 = CONCAT44(local_90._4_4_,uVar13);
  local_80 = (long)local_50 - (long)local_48 >> 4;
  local_88 = __n;
  if ((char)local_98 == '\0') {
    if (pIVar1 != pIVar4) {
      local_98 = __n + (__n == 0);
      uVar12 = 0;
      do {
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start = (IntPoint *)0x0;
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
        local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                  (&local_b8,local_80);
        pIVar4 = (poly->
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
            _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
          lVar14 = 8;
          uVar11 = 0;
          do {
            pIVar1 = (path->
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_78.X = pIVar1[uVar12].X - *(long *)((long)pIVar4 + lVar14 + -8);
            local_78.Y = pIVar1[uVar12].Y - *(long *)((long)&pIVar4->X + lVar14);
            if (local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_b8.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
              _M_realloc_insert<ClipperLib::IntPoint>
                        (&local_b8,
                         (iterator)
                         local_b8.
                         super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_78);
            }
            else {
              (local_b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->X = local_78.X;
              (local_b8.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish)->Y = local_78.Y;
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_b8.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar11 = uVar11 + 1;
            pIVar4 = (poly->
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar14 = lVar14 + 0x10;
          } while (uVar11 < (ulong)((long)(poly->
                                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4
                                   >> 4));
        }
        std::
        vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        ::push_back(&local_68,&local_b8);
        __n = local_88;
        uVar13 = (uint)local_90;
        if (local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_98);
    }
  }
  else if (pIVar1 != pIVar4) {
    local_98 = __n + (__n == 0);
    uVar12 = 0;
    do {
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start = (IntPoint *)0x0;
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
      local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                (&local_b8,local_80);
      pIVar4 = (poly->
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((poly->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
          _M_impl.super__Vector_impl_data._M_finish != pIVar4) {
        lVar14 = 8;
        uVar11 = 0;
        do {
          pIVar1 = (path->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          local_78.X = *(long *)((long)pIVar4 + lVar14 + -8) + pIVar1[uVar12].X;
          local_78.Y = *(long *)((long)&pIVar4->X + lVar14) + pIVar1[uVar12].Y;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
            _M_realloc_insert<ClipperLib::IntPoint>
                      (&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_78);
          }
          else {
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = local_78.X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = local_78.Y;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = uVar11 + 1;
          pIVar4 = (poly->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          lVar14 = lVar14 + 0x10;
        } while (uVar11 < (ulong)((long)(poly->
                                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4
                                 >> 4));
      }
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::push_back(&local_68,&local_b8);
      __n = local_88;
      uVar13 = (uint)local_90;
      if (local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_98);
  }
  this = local_40;
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::_M_erase_at_end(local_40,(local_40->
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::reserve(this,(local_80 + 1) * ((uVar13 & 0xff) + __n));
  local_38 = __n - (byte)((byte)uVar13 ^ 1);
  if (local_38 != 0) {
    local_98 = local_80 + (local_80 == 0);
    uVar12 = 0;
    do {
      if (local_50 != local_48) {
        local_90 = uVar12 + 1;
        uVar11 = 0;
        do {
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start = (IntPoint *)0x0;
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish = (IntPoint *)0x0;
          local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
                    (&local_b8,4);
          uVar7 = uVar12 % local_88;
          uVar8 = uVar11 % local_80;
          pIVar9 = local_68.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pIVar9);
          }
          else {
            cVar3 = pIVar9->Y;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = pIVar9->X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = cVar3;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar10 = local_90 % local_88;
          pIVar9 = local_68.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pIVar9);
          }
          else {
            cVar3 = pIVar9->Y;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = pIVar9->X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = cVar3;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = uVar11 + 1;
          uVar8 = uVar11 % local_80;
          pIVar9 = local_68.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pIVar9);
          }
          else {
            cVar3 = pIVar9->Y;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = pIVar9->X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = cVar3;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pIVar9 = local_68.
                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar7].
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar8;
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>>::
            _M_realloc_insert<ClipperLib::IntPoint_const&>
                      ((vector<ClipperLib::IntPoint,std::allocator<ClipperLib::IntPoint>> *)
                       &local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pIVar9);
          }
          else {
            cVar3 = pIVar9->Y;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->X = pIVar9->X;
            (local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)->Y = cVar3;
            local_b8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_b8.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          dVar2 = Area(&local_b8);
          if ((dVar2 < 0.0) &&
             (pIVar6 = local_b8.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1,
             pIVar9 = local_b8.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
             local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start < pIVar6 &&
             local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_b8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)) {
            do {
              pIVar5 = pIVar9 + 1;
              local_78.X = pIVar9->X;
              local_78.Y = pIVar9->Y;
              cVar3 = pIVar6->Y;
              pIVar9->X = pIVar6->X;
              pIVar9->Y = cVar3;
              pIVar6->X = local_78.X;
              pIVar6->Y = local_78.Y;
              pIVar6 = pIVar6 + -1;
              pIVar9 = pIVar5;
            } while (pIVar5 < pIVar6);
          }
          std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::push_back(local_40,&local_b8);
          if (local_b8.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
            operator_delete(local_b8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_b8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_b8.
                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        } while (uVar11 != local_98);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != local_38);
  }
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void Minkowski(const Path& poly, const Path& path, 
  Paths& solution, bool isSum, bool isClosed)
{
  int delta = (isClosed ? 1 : 0);
  size_t polyCnt = poly.size();
  size_t pathCnt = path.size();
  Paths pp;
  pp.reserve(pathCnt);
  if (isSum)
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X + poly[j].X, path[i].Y + poly[j].Y));
      pp.push_back(p);
    }
  else
    for (size_t i = 0; i < pathCnt; ++i)
    {
      Path p;
      p.reserve(polyCnt);
      for (size_t j = 0; j < poly.size(); ++j)
        p.push_back(IntPoint(path[i].X - poly[j].X, path[i].Y - poly[j].Y));
      pp.push_back(p);
    }

  solution.clear();
  solution.reserve((pathCnt + delta) * (polyCnt + 1));
  for (size_t i = 0; i < pathCnt - 1 + delta; ++i)
    for (size_t j = 0; j < polyCnt; ++j)
    {
      Path quad;
      quad.reserve(4);
      quad.push_back(pp[i % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][j % polyCnt]);
      quad.push_back(pp[(i + 1) % pathCnt][(j + 1) % polyCnt]);
      quad.push_back(pp[i % pathCnt][(j + 1) % polyCnt]);
      if (!Orientation(quad)) ReversePath(quad);
      solution.push_back(quad);
    }
}